

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerCore.cc
# Opt level: O0

void __thiscall PowerCore::requestInterrupt(PowerCore *this)

{
  PowerCore *this_local;
  memory_order __b;
  
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  LOCK();
  (this->interruptFlag).super___atomic_flag_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void PowerCore::requestInterrupt()
{
    interruptFlag.clear();
}